

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_string.cpp
# Opt level: O2

string * duckdb::StandardStringCast<duckdb::uhugeint_t>
                   (string *__return_storage_ptr__,uhugeint_t input)

{
  Vector *in_RCX;
  uhugeint_t value;
  LogicalType local_b0;
  anon_union_16_2_67f50693_for_value local_98;
  Vector v;
  
  LogicalType::LogicalType(&local_b0,VARCHAR);
  Vector::Vector(&v,&local_b0,0x800);
  LogicalType::~LogicalType(&local_b0);
  value.upper = (uint64_t)&v;
  value.lower = input.upper;
  local_98.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       UhugeintToStringCast::Format((UhugeintToStringCast *)input.lower,value,in_RCX);
  string_t::GetString_abi_cxx11_(__return_storage_ptr__,(string_t *)&local_98.pointer);
  Vector::~Vector(&v);
  return __return_storage_ptr__;
}

Assistant:

string StandardStringCast(T input) {
	Vector v(LogicalType::VARCHAR);
	return StringCast::Operation(input, v).GetString();
}